

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

SmallBuffer * helics::typeConvert(DataType type,Time val)

{
  string_view valname;
  string_view valname_00;
  initializer_list<double> __l;
  ulong uVar1;
  SmallBuffer *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  reference this_00;
  undefined4 in_ESI;
  SmallBuffer *in_RDI;
  double __r;
  json json;
  vector<double,_std::allocator<double>_> vec;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cval;
  long *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  double *in_stack_fffffffffffffdc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *other;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdd0;
  NamedPoint *in_stack_fffffffffffffdd8;
  NamedPoint *in_stack_fffffffffffffde0;
  size_t in_stack_fffffffffffffde8;
  allocator_type *__a;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdf0;
  iterator in_stack_fffffffffffffdf8;
  size_type in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffe10;
  DataType in_stack_fffffffffffffe3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator_type local_171;
  double local_170;
  double *local_168;
  undefined8 local_160;
  undefined8 local_140;
  double local_138;
  __sv_type local_c0;
  __sv_type local_58;
  complex<double> local_38;
  baseType local_28;
  double local_20;
  TimeRepresentation<count_time<9,_long>_> local_10 [2];
  
  switch(in_ESI) {
  case 0:
  case 9:
    TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode(local_10);
    helicsIntString_abi_cxx11_((int64_t)in_stack_fffffffffffffdd0);
    local_58 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdc0);
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(in_stack_fffffffffffffdc0);
    break;
  case 1:
    local_20 = TimeRepresentation::operator_cast_to_double
                         ((TimeRepresentation<count_time<9,_long>_> *)0x43b01f);
    ValueConverter<double>::convert((double *)in_stack_fffffffffffffdd8);
    break;
  case 2:
  case 8:
    local_28 = TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode(local_10);
    ValueConverter<long>::convert((long *)in_stack_fffffffffffffdd8);
    break;
  case 3:
  default:
    __r = TimeRepresentation::operator_cast_to_double
                    ((TimeRepresentation<count_time<9,_long>_> *)0x43b07a);
    std::complex<double>::complex(&local_38,__r,0.0);
    ValueConverter<std::complex<double>_>::convert((complex<double> *)in_stack_fffffffffffffdd8);
    break;
  case 4:
    local_170 = TimeRepresentation::operator_cast_to_double
                          ((TimeRepresentation<count_time<9,_long>_> *)0x43b3c0);
    local_168 = &local_170;
    local_160 = 1;
    __a = &local_171;
    std::allocator<double>::allocator((allocator<double> *)0x43b3f7);
    __l._M_len = in_stack_fffffffffffffe00;
    __l._M_array = in_stack_fffffffffffffdf8;
    std::vector<double,_std::allocator<double>_>::vector(in_stack_fffffffffffffdf0,__l,__a);
    std::allocator<double>::~allocator(&local_171);
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0);
    break;
  case 5:
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x43b329);
    local_138 = TimeRepresentation::operator_cast_to_double
                          ((TimeRepresentation<count_time<9,_long>_> *)0x43b336);
    local_140 = 0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double,double>
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               (double *)in_stack_fffffffffffffdc0);
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
            in_stack_fffffffffffffdd8);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_fffffffffffffdd0);
    break;
  case 6:
    uVar1 = TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode(local_10);
    if (uVar1 < 0x10000000000001) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
      TimeRepresentation::operator_cast_to_double
                ((TimeRepresentation<count_time<9,_long>_> *)0x43b2ac);
      valname_00._M_str = (char *)in_stack_fffffffffffffdf0;
      valname_00._M_len = in_stack_fffffffffffffde8;
      NamedPoint::NamedPoint(in_stack_fffffffffffffde0,valname_00,(double)in_stack_fffffffffffffdd8)
      ;
      ValueConverter<helics::NamedPoint>::convert(in_stack_fffffffffffffdd8);
      NamedPoint::~NamedPoint((NamedPoint *)0x43b2ec);
    }
    else {
      TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode(local_10);
      helicsIntString_abi_cxx11_((int64_t)in_stack_fffffffffffffdd0);
      local_c0 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdc0)
      ;
      nan("0");
      valname._M_str = (char *)in_stack_fffffffffffffdf0;
      valname._M_len = in_stack_fffffffffffffde8;
      NamedPoint::NamedPoint(in_stack_fffffffffffffde0,valname,(double)in_stack_fffffffffffffdd8);
      ValueConverter<helics::NamedPoint>::convert(in_stack_fffffffffffffdd8);
      NamedPoint::~NamedPoint((NamedPoint *)0x43b230);
      std::__cxx11::string::~string(in_stack_fffffffffffffdc0);
    }
    break;
  case 7:
    TimeRepresentation<count_time<9,_long>_>::operator!=
              (local_10,(TimeRepresentation<count_time<9,_long>_> *)&timeZero);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdd8);
    break;
  case 0x1e:
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    this = (SmallBuffer *)typeNameStringRef_abi_cxx11_(in_stack_fffffffffffffe3c);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffdd8);
    u = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::operator[]<char_const>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    other = &local_1a8.field_2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffdd0,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)other);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffdc0);
    TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode(local_10);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<long,_long,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    this_00 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    this_01 = &local_1a8;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=(this_00,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)other);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)this_01);
    fileops::generateJsonString((json *)other,SUB81((ulong)this_01 >> 0x38,0));
    SmallBuffer::SmallBuffer<std::__cxx11::string,void>(this,u);
    std::__cxx11::string::~string(this_01);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)this_01);
  }
  return in_RDI;
}

Assistant:

SmallBuffer typeConvert(DataType type, Time val)
{
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(static_cast<double>(val));
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(val.getBaseTimeCode());
        case DataType::HELICS_COMPLEX:
        default:
            return ValueConverter<std::complex<double>>::convert(
                std::complex<double>(static_cast<double>(val), 0.0));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((val != timeZero) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(
                helicsIntString(val.getBaseTimeCode()));
        case DataType::HELICS_NAMED_POINT:
            if (static_cast<uint64_t>(val.getBaseTimeCode()) >
                (2ULL << 51U))  // this checks whether the actual value will fit in a double
            {
                return ValueConverter<NamedPoint>::convert(
                    NamedPoint{helicsIntString(val.getBaseTimeCode()), std::nan("0")});
            } else {
                return ValueConverter<NamedPoint>::convert(
                    NamedPoint{"value", static_cast<double>(val)});
            }
        case DataType::HELICS_COMPLEX_VECTOR: {
            std::vector<std::complex<double>> cval;
            cval.emplace_back(static_cast<double>(val), 0.0);
            return ValueConverter<std::vector<std::complex<double>>>::convert(cval);
        }
        case DataType::HELICS_VECTOR: {
            const std::vector<double> vec{static_cast<double>(val)};
            return ValueConverter<std::vector<double>>::convert(vec);
        }
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_TIME);
            json["value"] = val.getBaseTimeCode();
            return fileops::generateJsonString(json);
        }
    }
}